

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::Collator::internalCompareUTF8
          (Collator *this,char *left,int32_t leftLength,char *right,int32_t rightLength,
          UErrorCode *errorCode)

{
  char *pcVar1;
  UBool UVar2;
  size_t sVar3;
  int32_t local_84;
  int32_t local_74;
  StringPiece local_60;
  StringPiece local_50;
  UErrorCode *local_40;
  UErrorCode *errorCode_local;
  char *pcStack_30;
  int32_t rightLength_local;
  char *right_local;
  char *pcStack_20;
  int32_t leftLength_local;
  char *left_local;
  Collator *this_local;
  
  local_40 = errorCode;
  errorCode_local._4_4_ = rightLength;
  pcStack_30 = right;
  right_local._4_4_ = leftLength;
  pcStack_20 = left;
  left_local = (char *)this;
  UVar2 = ::U_FAILURE(*errorCode);
  pcVar1 = pcStack_20;
  if (UVar2 == '\0') {
    if (((pcStack_20 == (char *)0x0) && (right_local._4_4_ != 0)) ||
       ((pcStack_30 == (char *)0x0 && (errorCode_local._4_4_ != 0)))) {
      *local_40 = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = UCOL_EQUAL;
    }
    else {
      if (right_local._4_4_ < 0) {
        sVar3 = strlen(pcStack_20);
        local_74 = (int32_t)sVar3;
      }
      else {
        local_74 = right_local._4_4_;
      }
      StringPiece::StringPiece(&local_50,pcVar1,local_74);
      pcVar1 = pcStack_30;
      if (errorCode_local._4_4_ < 0) {
        sVar3 = strlen(pcStack_30);
        local_84 = (int32_t)sVar3;
      }
      else {
        local_84 = errorCode_local._4_4_;
      }
      StringPiece::StringPiece(&local_60,pcVar1,local_84);
      this_local._4_4_ =
           (*(this->super_UObject)._vptr_UObject[0xd])(this,&local_50,&local_60,local_40);
    }
  }
  else {
    this_local._4_4_ = UCOL_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

UCollationResult
Collator::internalCompareUTF8(const char *left, int32_t leftLength,
                              const char *right, int32_t rightLength,
                              UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_EQUAL; }
    if((left == NULL && leftLength != 0) || (right == NULL && rightLength != 0)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    return compareUTF8(
            StringPiece(left, (leftLength < 0) ? static_cast<int32_t>(uprv_strlen(left)) : leftLength),
            StringPiece(right, (rightLength < 0) ? static_cast<int32_t>(uprv_strlen(right)) : rightLength),
            errorCode);
}